

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O2

void __thiscall
testing::internal::StreamingListener::SocketWriter::Send(SocketWriter *this,string *message)

{
  size_t __n;
  ostream *poVar1;
  size_t sVar2;
  int __fd;
  GTestLog GStack_18;
  GTestLog local_14;
  
  __fd = this->sockfd_;
  if (__fd == -1) {
    GTestLog::GTestLog(&local_14,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/googletest/googletest/src/gtest-internal-inl.h"
                       ,0x445);
    poVar1 = std::operator<<((ostream *)&std::cerr,"Condition sockfd_ != -1 failed. ");
    std::operator<<(poVar1,"Send() can be called only when there is a connection.");
    GTestLog::~GTestLog(&local_14);
    __fd = this->sockfd_;
  }
  __n = message->_M_string_length;
  sVar2 = write(__fd,(message->_M_dataplus)._M_p,__n);
  if (sVar2 != __n) {
    GTestLog::GTestLog(&GStack_18,GTEST_WARNING,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/googletest/googletest/src/gtest-internal-inl.h"
                       ,0x44a);
    poVar1 = std::operator<<((ostream *)&std::cerr,"stream_result_to: failed to stream to ");
    poVar1 = std::operator<<(poVar1,(string *)&this->host_name_);
    poVar1 = std::operator<<(poVar1,":");
    std::operator<<(poVar1,(string *)&this->port_num_);
    GTestLog::~GTestLog(&GStack_18);
  }
  return;
}

Assistant:

void Send(const std::string& message) override {
      GTEST_CHECK_(sockfd_ != -1)
          << "Send() can be called only when there is a connection.";

      const auto len = static_cast<size_t>(message.length());
      if (write(sockfd_, message.c_str(), len) != static_cast<ssize_t>(len)) {
        GTEST_LOG_(WARNING) << "stream_result_to: failed to stream to "
                            << host_name_ << ":" << port_num_;
      }
    }